

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

uint luaS_hash(char *str,size_t l,uint seed)

{
  ulong uVar1;
  size_t step;
  uint h;
  uint seed_local;
  size_t l_local;
  char *str_local;
  
  step._0_4_ = seed ^ (uint)l;
  uVar1 = (l >> 5) + 1;
  for (_h = l; uVar1 <= _h; _h = _h - uVar1) {
    step._0_4_ = (uint)step * 0x20 + ((uint)step >> 2) + (uint)(byte)str[_h - 1] ^ (uint)step;
  }
  return (uint)step;
}

Assistant:

unsigned int luaS_hash(const char *str, size_t l, unsigned int seed) {
    unsigned int h = seed ^cast(unsigned int, l);
    size_t step = (l >> LUAI_HASHLIMIT) + 1;
    for (; l >= step; l -= step)
        h ^= ((h << 5) + (h >> 2) + cast_byte(str[l - 1]));
    return h;
}